

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_histogram.c
# Opt level: O0

REF_STATUS ref_histogram_add(REF_HISTOGRAM ref_histogram,REF_DBL observation)

{
  double dVar1;
  int local_40;
  int local_3c;
  REF_DBL local_38;
  REF_DBL local_30;
  REF_INT i;
  REF_DBL observation_local;
  REF_HISTOGRAM ref_histogram_local;
  
  if (0.0 < observation) {
    local_30 = observation;
    if (observation < ref_histogram->max) {
      local_30 = ref_histogram->max;
    }
    ref_histogram->max = local_30;
    local_38 = observation;
    if (ref_histogram->min < observation) {
      local_38 = ref_histogram->min;
    }
    ref_histogram->min = local_38;
    dVar1 = log2(observation);
    ref_histogram->log_total = dVar1 + ref_histogram->log_total;
    local_3c = ref_histogram_to_bin(ref_histogram,observation);
    if (ref_histogram->nbin + -1 <= local_3c) {
      local_3c = ref_histogram->nbin + -1;
    }
    if (local_3c < 1) {
      local_40 = 0;
    }
    else {
      local_40 = local_3c;
    }
    ref_histogram->bins[local_40] = ref_histogram->bins[local_40] + 1;
    if (ref_histogram->df != (FILE *)0x0) {
      fprintf((FILE *)ref_histogram->df,"%f\n",observation);
    }
    ref_histogram_local._4_4_ = 0;
  }
  else {
    ref_histogram_local._4_4_ = 3;
  }
  return ref_histogram_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_histogram_add(REF_HISTOGRAM ref_histogram,
                                     REF_DBL observation) {
  REF_INT i;

  if (observation <= 0.0) return REF_INVALID;

  ref_histogram_max(ref_histogram) =
      MAX(ref_histogram_max(ref_histogram), observation);
  ref_histogram_min(ref_histogram) =
      MIN(ref_histogram_min(ref_histogram), observation);
  ref_histogram_log_total(ref_histogram) += log2(observation);

  i = ref_histogram_to_bin(ref_histogram, observation);
  i = MIN(i, ref_histogram_nbin(ref_histogram) - 1);
  i = MAX(i, 0);

  ref_histogram_bin(ref_histogram, i)++;

  if (NULL != ref_histogram->df)
    fprintf(ref_histogram->df, "%f\n", observation);

  return REF_SUCCESS;
}